

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

string_view __thiscall
slang::SourceManager::getMacroName(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  SourceRange SVar6;
  string_view sVar7;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  while (bVar2 = isMacroArgLocImpl<std::shared_lock<std::shared_mutex>_>(this,location,&local_28),
        bVar2) {
    SVar6 = getExpansionRangeImpl<std::shared_lock<std::shared_mutex>_>(this,location,&local_28);
    location = SVar6.startLoc;
  }
  uVar3 = (ulong)location & 0xfffffff;
  if (uVar3 != 0) {
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = (char *)0x0;
    if (pvVar1 != (pointer)0x0) {
      sVar5 = 0;
      if (*(__index_type *)
           ((long)&pvVar1[uVar3].
                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
           + 0x38) == '\x01') {
        sVar5 = *(size_t *)
                 ((long)&pvVar1[uVar3].
                         super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                         .
                         super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                         .
                         super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 + 0x20);
        pcVar4 = *(char **)((long)&pvVar1[uVar3].
                                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                                   .
                                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                                   .
                                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                           + 0x28);
      }
      goto LAB_0019868f;
    }
  }
  pcVar4 = (char *)0x0;
  sVar5 = 0;
LAB_0019868f:
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  sVar7._M_str = pcVar4;
  sVar7._M_len = sVar5;
  return sVar7;
}

Assistant:

std::string_view SourceManager::getMacroName(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    while (isMacroArgLocImpl(location, lock))
        location = getExpansionRangeImpl(location, lock).start();

    auto buffer = location.buffer();
    if (!buffer)
        return {};

    SLANG_ASSERT(buffer.getId() < bufferEntries.size());
    auto info = std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]);
    if (!info)
        return {};

    return info->macroName;
}